

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O2

uint8_t * apx_signatureParser_parse_data_signature
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  apx_signatureParserState_t *paVar1;
  uint8_t *puVar2;
  
  if ((((begin <= end) && (self != (apx_signatureParser_t *)0x0)) && (begin != (uint8_t *)0x0)) &&
     (end != (uint8_t *)0x0)) {
    self->error_code = 0;
    self->error_pos = (uint8_t *)0x0;
    apx_signatureParserState_delete(self->state);
    paVar1 = apx_signatureParserState_new(false);
    self->state = paVar1;
    if (paVar1 == (apx_signatureParserState_t *)0x0) {
      self->error_code = 2;
      self->error_pos = begin;
    }
    puVar2 = apx_signatureParser_parse_data_element(self,begin,end);
    return puVar2;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t const* apx_signatureParser_parse_data_signature(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   if ((self != NULL) && (begin != NULL) && (end != NULL) && (begin <= end))
   {
      apx_signatureParser_reset(self);
      self->state = apx_signatureParserState_new(false);
      if (self->state == NULL)
      {
         apx_signatureParser_set_error(self, APX_MEM_ERROR, begin);
      }
      return apx_signatureParser_parse_data_element(self, begin, end);
   }
   return NULL;
}